

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O2

void __thiscall irr::gui::IGUIElement::draw(IGUIElement *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[0xd])();
  if ((char)iVar1 != '\0') {
    p_Var2 = (_List_node_base *)&this->Children;
    while (p_Var2 = (((_List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                       *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&this->Children) {
      (**(code **)(*(long *)p_Var2[1]._M_next + 0x50))();
    }
  }
  return;
}

Assistant:

virtual void draw()
	{
		if (isVisible()) {
			for (auto child : Children)
				child->draw();
		}
	}